

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  long lVar1;
  FieldDescriptor *this;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  int iVar5;
  undefined4 extraout_var;
  Reflection *this_00;
  Descriptor *pDVar6;
  MapFieldBase *this_01;
  Message *pMVar7;
  ulong uVar8;
  ulong uVar9;
  int index;
  long lVar10;
  long lVar11;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a8;
  MapIterator local_90;
  MapIterator local_60;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])();
  this_00 = GetReflectionOrDie(message);
  lVar10 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(CONCAT44(extraout_var,iVar3) + 0x68); lVar11 = lVar11 + 1) {
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x28);
    if ((*(int *)(lVar1 + 0x3c + lVar10) == 2) &&
       (bVar2 = Reflection::HasField(this_00,message,(FieldDescriptor *)(lVar1 + lVar10)), !bVar2))
    {
      return false;
    }
    lVar10 = lVar10 + 0x98;
  }
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields
            (this_00,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&local_a8);
  for (uVar9 = 0;
      uVar8 = (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 3, uVar9 < uVar8;
      uVar9 = uVar9 + 1) {
    this = local_a8._M_impl.super__Vector_impl_data._M_start[uVar9];
    CVar4 = FieldDescriptor::cpp_type(this);
    if (CVar4 == CPPTYPE_MESSAGE) {
      bVar2 = FieldDescriptor::is_map(this);
      if (bVar2) {
        pDVar6 = FieldDescriptor::message_type(this);
        CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)(*(long *)(pDVar6 + 0x28) + 0x98));
        if (CVar4 == CPPTYPE_MESSAGE) {
          this_01 = Reflection::GetMapData(this_00,message,this);
          bVar2 = MapFieldBase::IsMapValid(this_01);
          if (!bVar2) goto LAB_00277c6d;
          MapIterator::MapIterator(&local_90,message,this);
          MapIterator::MapIterator(&local_60,message,this);
          (*this_01->_vptr_MapFieldBase[6])(this_01,&local_90);
          (*this_01->_vptr_MapFieldBase[7])(this_01,&local_60);
          while (iVar3 = (*(local_90.map_)->_vptr_MapFieldBase[5])
                                   (local_90.map_,&local_90,&local_60), (char)iVar3 == '\0') {
            pMVar7 = MapValueRef::GetMessageValue(&local_90.value_);
            iVar3 = (*(pMVar7->super_MessageLite)._vptr_MessageLite[8])(pMVar7);
            if ((char)iVar3 == '\0') {
              MapIterator::~MapIterator(&local_60);
              MapIterator::~MapIterator(&local_90);
              goto LAB_00277d09;
            }
            (*(local_90.map_)->_vptr_MapFieldBase[0x12])(local_90.map_,&local_90);
          }
          MapIterator::~MapIterator(&local_60);
          MapIterator::~MapIterator(&local_90);
        }
      }
      else {
LAB_00277c6d:
        if (*(int *)(this + 0x3c) == 3) {
          iVar3 = Reflection::FieldSize(this_00,message,this);
          index = 0;
          if (iVar3 < 1) {
            iVar3 = index;
          }
          while (iVar3 != index) {
            pMVar7 = Reflection::GetRepeatedMessage(this_00,message,this,index);
            iVar5 = (*(pMVar7->super_MessageLite)._vptr_MessageLite[8])(pMVar7);
            index = index + 1;
            if ((char)iVar5 == '\0') goto LAB_00277d09;
          }
        }
        else {
          pMVar7 = Reflection::GetMessage(this_00,message,this,(MessageFactory *)0x0);
          iVar3 = (*(pMVar7->super_MessageLite)._vptr_MessageLite[8])(pMVar7);
          if ((char)iVar3 == '\0') break;
        }
      }
    }
  }
LAB_00277d09:
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_a8);
  return uVar8 <= uVar9;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        return false;
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}